

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_cache.cc
# Opt level: O0

bool __thiscall
ctemplate::TemplateCache::ExpandNoLoad
          (TemplateCache *this,TemplateString *filename,Strip strip,
          TemplateDictionaryInterface *dict,PerExpandData *per_expand_data,
          ExpandEmitter *expand_emitter)

{
  bool bVar1;
  ostream *poVar2;
  second_type *psVar3;
  Template *this_00;
  TemplateDictionaryInterface *pTVar4;
  pair<unsigned_long,_int> v;
  WriterMutexLock local_a8;
  WriterMutexLock ml_1;
  bool result;
  CachedTemplate *it;
  ReaderMutexLock local_70;
  ReaderMutexLock ml;
  CachedTemplate cached_tpl;
  undefined1 auStack_50 [8];
  TemplateCacheKey template_cache_key;
  ExpandEmitter *expand_emitter_local;
  PerExpandData *per_expand_data_local;
  TemplateDictionaryInterface *dict_local;
  TemplateString *pTStack_20;
  Strip strip_local;
  TemplateString *filename_local;
  TemplateCache *this_local;
  
  pTVar4 = dict;
  template_cache_key._8_8_ = expand_emitter;
  dict_local._4_4_ = strip;
  pTStack_20 = filename;
  filename_local = (TemplateString *)this;
  cached_tpl._8_8_ = TemplateString::GetGlobalId(filename);
  std::pair<unsigned_long,_int>::pair<unsigned_long,_ctemplate::Strip_&,_true>
            ((pair<unsigned_long,_int> *)auStack_50,(unsigned_long *)&cached_tpl.should_reload,
             (Strip *)((long)&dict_local + 4));
  CachedTemplate::CachedTemplate((CachedTemplate *)&ml);
  ReaderMutexLock::ReaderMutexLock(&local_70,this->mutex_);
  if ((this->is_frozen_ & 1U) == 0) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"DFATAL: ");
    std::operator<<(poVar2,": ExpandNoLoad() only works on frozen caches.");
    this_local._7_1_ = 0;
    bVar1 = true;
  }
  else {
    v.first = template_cache_key.first & 0xffffffff;
    v._8_8_ = pTVar4;
    psVar3 = find_ptr<std::unordered_map<std::pair<unsigned_long,int>,ctemplate::TemplateCache::CachedTemplate,ctemplate::TemplateCache::TemplateCacheHash,std::equal_to<std::pair<unsigned_long,int>>,std::allocator<std::pair<std::pair<unsigned_long,int>const,ctemplate::TemplateCache::CachedTemplate>>>,std::pair<unsigned_long,int>>
                       ((ctemplate *)this->parsed_template_cache_,
                        (unordered_map<std::pair<unsigned_long,_int>,_ctemplate::TemplateCache::CachedTemplate,_ctemplate::TemplateCache::TemplateCacheHash,_std::equal_to<std::pair<unsigned_long,_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_long,_int>,_ctemplate::TemplateCache::CachedTemplate>_>_>
                         *)auStack_50,v);
    if (psVar3 == (second_type *)0x0) {
      this_local._7_1_ = 0;
      bVar1 = true;
    }
    else {
      ml.mu_ = (Mutex *)psVar3->refcounted_tpl;
      cached_tpl.refcounted_tpl = *(RefcountedTemplate **)&psVar3->should_reload;
      RefcountedTemplate::IncRef((RefcountedTemplate *)ml.mu_);
      bVar1 = false;
    }
  }
  ReaderMutexLock::~ReaderMutexLock(&local_70);
  if (!bVar1) {
    this_00 = RefcountedTemplate::tpl((RefcountedTemplate *)ml.mu_);
    ml_1.mu_._7_1_ =
         Template::ExpandWithDataAndCache
                   (this_00,(ExpandEmitter *)template_cache_key._8_8_,dict,per_expand_data,this);
    WriterMutexLock::WriterMutexLock(&local_a8,this->mutex_);
    RefcountedTemplate::DecRef((RefcountedTemplate *)ml.mu_);
    WriterMutexLock::~WriterMutexLock(&local_a8);
    this_local._7_1_ = ml_1.mu_._7_1_ & 1;
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool TemplateCache::ExpandNoLoad(
    const TemplateString& filename,
    Strip strip,
    const TemplateDictionaryInterface *dict,
    PerExpandData *per_expand_data,
    ExpandEmitter *expand_emitter) const {
  TemplateCacheKey template_cache_key(filename.GetGlobalId(), strip);
  CachedTemplate cached_tpl;
  {
    ReaderMutexLock ml(mutex_);
    if (!is_frozen_) {
      LOG(DFATAL) << ": ExpandNoLoad() only works on frozen caches.";
      return false;
    }
    CachedTemplate* it = find_ptr(*parsed_template_cache_, template_cache_key);
    if (!it) {
      return false;
    }
    cached_tpl = *it;
    cached_tpl.refcounted_tpl->IncRef();
  }
  const bool result = cached_tpl.refcounted_tpl->tpl()->ExpandWithDataAndCache(
      expand_emitter, dict, per_expand_data, this);
  {
    WriterMutexLock ml(mutex_);
    cached_tpl.refcounted_tpl->DecRef();
  }
  return result;
}